

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void sect_BinaryFileSlice(char *s,int32_t start_pos,int32_t length)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  uint32_t uVar8;
  int byte;
  int32_t fsize;
  FILE *f;
  size_t size;
  char *fullPath;
  int32_t length_local;
  int32_t start_pos_local;
  char *s_local;
  
  fullPath._0_4_ = length;
  fullPath._4_4_ = start_pos;
  _length_local = s;
  if (start_pos < 0) {
    error("Start position cannot be negative (%d)\n",(ulong)(uint)start_pos);
    fullPath._4_4_ = 0;
  }
  if ((int)(uint32_t)fullPath < 0) {
    error("Number of bytes to read cannot be negative (%d)\n",(ulong)(uint32_t)fullPath);
    fullPath._0_4_ = 0;
  }
  bVar2 = checkcodesection();
  if (!bVar2) {
    return;
  }
  if ((uint32_t)fullPath == 0) {
    return;
  }
  bVar2 = reserveSpace((uint32_t)fullPath);
  if (!bVar2) {
    return;
  }
  size = 0;
  f = (FILE *)0x0;
  _byte = (FILE *)0x0;
  bVar2 = fstk_FindFile(_length_local,(char **)&size,(size_t *)&f);
  if (bVar2) {
    _byte = fopen((char *)size,"rb");
  }
  free((void *)size);
  pcVar1 = _length_local;
  if (_byte == (FILE *)0x0) {
    if ((generatedMissingIncludes & 1U) != 0) {
      if ((verbose & 1U) != 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        printf("Aborting (-MG) on INCBIN file \'%s\' (%s)\n",pcVar1,pcVar5);
      }
      failedOnMissingInclude = true;
      return;
    }
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    error("Error opening INCBIN file \'%s\': %s\n",pcVar1,pcVar5);
    return;
  }
  iVar3 = fseek(_byte,0,2);
  if (iVar3 == -1) {
    piVar4 = __errno_location();
    pcVar1 = _length_local;
    if (*piVar4 != 0x1d) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      error("Error determining size of INCBIN file \'%s\': %s\n",pcVar1,pcVar5);
    }
    while (uVar7 = fullPath._4_4_ - 1, bVar2 = fullPath._4_4_ != 0, fullPath._4_4_ = uVar7, bVar2) {
      fgetc(_byte);
    }
  }
  else {
    uVar6 = ftell(_byte);
    if ((int)uVar6 < (int)fullPath._4_4_) {
      error("Specified start position is greater than length of file\n");
      goto LAB_0011a012;
    }
    if ((int)uVar6 < (int)(fullPath._4_4_ + (uint32_t)fullPath)) {
      error("Specified range in INCBIN is out of bounds (%u + %u > %u)\n",(ulong)fullPath._4_4_,
            (ulong)(uint32_t)fullPath,uVar6 & 0xffffffff);
      goto LAB_0011a012;
    }
    fseek(_byte,(long)(int)fullPath._4_4_,0);
  }
  while (uVar8 = (uint32_t)fullPath - 1, bVar2 = (uint32_t)fullPath != 0, fullPath._0_4_ = uVar8,
        bVar2) {
    iVar3 = fgetc(_byte);
    if (iVar3 == -1) {
      iVar3 = ferror(_byte);
      pcVar1 = _length_local;
      if (iVar3 == 0) {
        error("Premature end of file (%d bytes left to read)\n",(ulong)((uint32_t)fullPath + 1));
      }
      else {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        error("Error reading INCBIN file \'%s\': %s\n",pcVar1,pcVar5);
      }
    }
    else {
      writebyte((uint8_t)iVar3);
    }
  }
LAB_0011a012:
  fclose(_byte);
  return;
}

Assistant:

void sect_BinaryFileSlice(char const *s, int32_t start_pos, int32_t length)
{
	if (start_pos < 0) {
		error("Start position cannot be negative (%" PRId32 ")\n", start_pos);
		start_pos = 0;
	}

	if (length < 0) {
		error("Number of bytes to read cannot be negative (%" PRId32 ")\n", length);
		length = 0;
	}

	if (!checkcodesection())
		return;
	if (length == 0) // Don't even bother with 0-byte slices
		return;
	if (!reserveSpace(length))
		return;

	char *fullPath = NULL;
	size_t size = 0;
	FILE *f = NULL;

	if (fstk_FindFile(s, &fullPath, &size))
		f = fopen(fullPath, "rb");
	free(fullPath);

	if (!f) {
		if (generatedMissingIncludes) {
			if (verbose)
				printf("Aborting (-MG) on INCBIN file '%s' (%s)\n", s, strerror(errno));
			failedOnMissingInclude = true;
		} else {
			error("Error opening INCBIN file '%s': %s\n", s, strerror(errno));
		}
		return;
	}

	int32_t fsize;

	if (fseek(f, 0, SEEK_END) != -1) {
		fsize = ftell(f);

		if (start_pos > fsize) {
			error("Specified start position is greater than length of file\n");
			goto cleanup;
		}

		if ((start_pos + length) > fsize) {
			error("Specified range in INCBIN is out of bounds (%" PRIu32 " + %" PRIu32
			      " > %" PRIu32 ")\n", start_pos, length, fsize);
			goto cleanup;
		}

		fseek(f, start_pos, SEEK_SET);
	} else {
		if (errno != ESPIPE)
			error("Error determining size of INCBIN file '%s': %s\n",
				s, strerror(errno));
		// The file isn't seekable, so we'll just skip bytes
		while (start_pos--)
			(void)fgetc(f);
	}

	while (length--) {
		int byte = fgetc(f);

		if (byte != EOF) {
			writebyte(byte);
		} else if (ferror(f)) {
			error("Error reading INCBIN file '%s': %s\n", s, strerror(errno));
		} else {
			error("Premature end of file (%" PRId32 " bytes left to read)\n",
				length + 1);
		}
	}

cleanup:
	fclose(f);
}